

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O2

void __thiscall Group::shuffle(Group *this)

{
  time_t tVar1;
  
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  return;
}

Assistant:

void Group::shuffle() {


    srand(time(0));
//    std::map<size_t,Lesson> m = lesson_map;
//    std::vector<size_t> v;
//
//       for(auto i: m)
//    {
//        v.push_back(i.first);
//    }
    //random_shuffle(lesson_map.begin(), lesson_map.end(),myrandom);
//    std::vector<size_t>::iterator it=v.begin();
//
//    for(auto& i:m)
//    {
//        Lesson ts=i.second;
//        i.second=m[*it];
//        m[*it]=ts;
//        it++;
//    }
//    lesson_map = m;

}